

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

void __thiscall
xemmai::t_heap<xemmai::t_object>::f_free(t_heap<xemmai::t_object> *this,t_object *a_p)

{
  size_t a_n;
  pointer ppVar1;
  unsigned_long n;
  iterator i;
  t_object *a_p_local;
  t_heap<xemmai::t_object> *this_local;
  
  i._M_node = (_Base_ptr)a_p;
  switch(a_p->v_rank) {
  case 0:
    t_of<0UL,_65536UL>::f_free(&this->v_of0,a_p);
    break;
  case 1:
    t_of<1UL,_16384UL>::f_free(&this->v_of1,a_p);
    break;
  case 2:
    t_of<2UL,_4096UL>::f_free(&this->v_of2,a_p);
    break;
  case 3:
    t_of<3UL,_1024UL>::f_free(&this->v_of3,a_p);
    break;
  case 4:
    t_of<4UL,_256UL>::f_free(&this->v_of4,a_p);
    break;
  default:
    std::mutex::lock(&this->v_mutex);
    n = (unsigned_long)
        std::
        map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
        ::find(&this->v_blocks,(key_type *)&i);
    ppVar1 = std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_unsigned_long>_> *)&n)
    ;
    a_n = ppVar1->second;
    std::
    map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
    ::erase_abi_cxx11_((map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
                        *)&this->v_blocks,(iterator)n);
    std::mutex::unlock(&this->v_mutex);
    f_unmap(i._M_node,a_n);
    this->v_freed = this->v_freed + 1;
  }
  return;
}

Assistant:

void f_free(T* a_p)
	{
		switch (a_p->v_rank) {
		case 0:
			v_of0.f_free(a_p);
			break;
		case 1:
			v_of1.f_free(a_p);
			break;
		case 2:
			v_of2.f_free(a_p);
			break;
		case 3:
			v_of3.f_free(a_p);
			break;
		case 4:
			v_of4.f_free(a_p);
			break;
		default:
			v_mutex.lock();
			auto i = v_blocks.find(a_p);
			auto n = i->second;
			v_blocks.erase(i);
			v_mutex.unlock();
			f_unmap(a_p, n);
			++v_freed;
		}
	}